

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<char,char>::
     construct<std::allocator<std::pair<char_const,char>>,std::piecewise_construct_t_const&,std::tuple<char_const&>,std::tuple<char_const&>>
               (allocator<std::pair<const_char,_char>_> *alloc,slot_type *slot,
               piecewise_construct_t *args,tuple<const_char_&> *args_1,tuple<const_char_&> *args_2)

{
  piecewise_construct_t *in_RCX;
  pair<char,_char> *in_RDX;
  allocator<std::pair<const_char,_char>_> *in_RSI;
  tuple<const_char_&> *in_R8;
  
  map_slot_policy<char,_char>::emplace((slot_type *)0x14b746);
  allocator_traits<std::allocator<std::pair<char_const,char>>>::
  construct<std::pair<char,char>,std::piecewise_construct_t_const&,std::tuple<char_const&>,std::tuple<char_const&>>
            (in_RSI,in_RDX,in_RCX,in_R8,(tuple<const_char_&> *)0x14b763);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args)
			{
				emplace(slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
					        std::forward<Args>(args)...);
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->value,
					        std::forward<Args>(args)...);
				}
			}